

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  secp256k1_scalar sVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  secp256k1_scalar *r_00;
  uint uVar6;
  secp256k1_fe *a;
  uint uVar7;
  code *pcVar8;
  bool bVar9;
  int vflag;
  uchar nonce32 [32];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  undefined8 uStack_1d0;
  secp256k1_scalar local_1c4;
  secp256k1_scalar local_1c0;
  secp256k1_scalar local_1bc;
  secp256k1_scalar local_1b8;
  int local_1b4;
  uchar *local_1b0;
  uint *local_1a8;
  secp256k1_context *local_1a0;
  uint local_198;
  uint local_194;
  uint *local_190;
  secp256k1_nonce_function local_188;
  secp256k1_scalar local_17c;
  uint local_178 [8];
  uchar local_158 [40];
  secp256k1_ge local_130;
  secp256k1_gej local_c8;
  
  local_1c4 = 0;
  *r = 0;
  *s = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  uStack_1d0 = (code *)0x1080f8;
  local_1b0 = seckey;
  local_1a0 = ctx;
  local_190 = r;
  local_198 = secp256k1_scalar_set_b32_seckey(&local_1b8,seckey);
  local_178[0] = local_198 ^ 1;
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[2] = 4;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  local_130.x.n[0] = 0;
  local_1b8 = local_178[0] & 1 | local_178[0] - 1 & local_1b8;
  uStack_1d0 = (code *)0x108166;
  local_c8.x.n[1] = (uint64_t)&local_1b8;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_1b8);
  lVar4 = 0;
  local_194 = 0;
  do {
    uVar5 = (uint)msg32[lVar4] | local_194 << 8;
    local_194 = uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc);
    if (uVar5 < 0xd) {
      local_194 = uVar5;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  pcVar8 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar8 = noncefp;
  }
  uStack_1d0 = (code *)0x1081b7;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_194);
  uVar5 = 0;
  uStack_1d0 = (code *)0x1081db;
  r_00 = (secp256k1_scalar *)msg32;
  local_188 = pcVar8;
  iVar3 = (*pcVar8)(local_158,msg32,local_1b0,(uchar *)0x0,noncedata,0);
  bVar9 = iVar3 != 0;
  local_1a8 = (uint *)recid;
  if (bVar9) {
    uVar7 = 1;
    do {
      local_1c4 = (secp256k1_scalar)bVar9;
      uStack_1d0 = (code *)0x108206;
      local_1c0 = secp256k1_scalar_set_b32_seckey(&local_1bc,local_158);
      if (local_1a0->declassify != 0) {
        local_c8.x.n[0] = 0x4d430002;
        local_c8.x.n[1] = (uint64_t)&local_1c0;
        local_c8.x.n[2] = 4;
        local_c8.x.n[3] = 0;
        local_c8.x.n[4] = 0;
        local_c8.x.magnitude = 0;
        local_c8.x.normalized = 0;
        local_130.x.n[0] = 0;
      }
      if (local_1c0 != 0) {
        local_1b4 = 0;
        uStack_1d0 = (code *)0x108246;
        secp256k1_ecmult_gen(&local_1a0->ecmult_gen_ctx,&local_c8,&local_1bc);
        uStack_1d0 = (code *)0x108259;
        secp256k1_ge_set_gej(&local_130,&local_c8);
        uStack_1d0 = (code *)0x108261;
        secp256k1_fe_normalize(&local_130.x);
        uStack_1d0 = (code *)0x10826e;
        secp256k1_fe_normalize(&local_130.y);
        r_00 = local_178;
        uStack_1d0 = (code *)0x10827e;
        secp256k1_fe_get_b32((uchar *)r_00,&local_130.x);
        puVar2 = local_190;
        uStack_1d0 = (code *)0x108293;
        secp256k1_scalar_set_b32(local_190,(uchar *)r_00,&local_1b4);
        iVar3 = local_1b4;
        if ((uint *)recid != (uint *)0x0) {
          a = &local_130.y;
          uStack_1d0 = (code *)0x1082a9;
          secp256k1_fe_verify(a);
          if (local_130.y.normalized == 0) {
            uStack_1d0 = (code *)0x108623;
            secp256k1_ecdsa_sign_inner_cold_1();
            goto LAB_00108623;
          }
          *recid = ((uint)local_130.y.n[0] & 1) + iVar3 * 2;
        }
        uStack_1d0 = (code *)0x1082dc;
        secp256k1_scalar_mul(&local_17c,puVar2,&local_1b8);
        uStack_1d0 = (code *)0x1082ec;
        secp256k1_scalar_add(&local_17c,&local_17c,&local_194);
        uStack_1d0 = (code *)0x1082f9;
        secp256k1_scalar_inverse(s,&local_1bc);
        uStack_1d0 = (code *)0x108307;
        r_00 = s;
        secp256k1_scalar_mul(s,s,&local_17c);
        uStack_1d0 = (code *)0x108314;
        secp256k1_gej_clear(&local_c8);
        uStack_1d0 = (code *)0x108321;
        secp256k1_ge_clear(&local_130);
        uStack_1d0 = (code *)0x108329;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        uVar5 = *s;
        uStack_1d0 = (code *)0x108333;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar5);
        if (6 < uVar5) {
          uStack_1d0 = (code *)0x108345;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
          uVar6 = 0xd - *s;
          if (*s == 0) {
            uVar6 = 0;
          }
          *s = uVar6;
          uStack_1d0 = (code *)0x10835c;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar6);
        }
        uStack_1d0 = (code *)0x108364;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        if (local_1a8 != (uint *)0x0) {
          *local_1a8 = *local_1a8 ^ (uint)(6 < uVar5);
        }
        uStack_1d0 = (code *)0x10837b;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*puVar2);
        sVar1 = *puVar2;
        uStack_1d0 = (code *)0x10838a;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        bVar9 = *s != 0 && sVar1 != 0;
        local_1c4 = (secp256k1_scalar)bVar9;
        if (local_1a0->declassify != 0) {
          local_c8.x.n[0] = 0x4d430002;
          local_c8.x.n[1] = (uint64_t)&local_1c4;
          local_c8.x.n[2] = 4;
          local_c8.x.n[3] = 0;
          local_c8.x.n[4] = 0;
          local_c8.x.magnitude = 0;
          local_c8.x.normalized = 0;
          local_130.x.n[0] = 0;
        }
        uVar5 = (uint)bVar9;
        recid = (int *)local_1a8;
        if (uVar5 != 0) break;
      }
      uVar5 = 0;
      uStack_1d0 = (code *)0x1083d9;
      r_00 = (secp256k1_scalar *)msg32;
      iVar3 = (*local_188)(local_158,msg32,local_1b0,(uchar *)0x0,noncedata,uVar7);
      uVar7 = uVar7 + 1;
      bVar9 = iVar3 != 0;
    } while (bVar9);
  }
  local_1c4 = uVar5 & local_198;
  local_158[0] = '\0';
  local_158[1] = '\0';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_158[4] = '\0';
  local_158[5] = '\0';
  local_158[6] = '\0';
  local_158[7] = '\0';
  local_158[8] = '\0';
  local_158[9] = '\0';
  local_158[10] = '\0';
  local_158[0xb] = '\0';
  local_158[0xc] = '\0';
  local_158[0xd] = '\0';
  local_158[0xe] = '\0';
  local_158[0xf] = '\0';
  local_158[0x10] = '\0';
  local_158[0x11] = '\0';
  local_158[0x12] = '\0';
  local_158[0x13] = '\0';
  local_158[0x14] = '\0';
  local_158[0x15] = '\0';
  local_158[0x16] = '\0';
  local_158[0x17] = '\0';
  local_158[0x18] = '\0';
  local_158[0x19] = '\0';
  local_158[0x1a] = '\0';
  local_158[0x1b] = '\0';
  local_158[0x1c] = '\0';
  local_158[0x1d] = '\0';
  local_158[0x1e] = '\0';
  local_158[0x1f] = '\0';
  local_1b8 = 0;
  local_178[0] = local_1c4 ^ 1;
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[1] = (uint64_t)local_190;
  local_c8.x.n[2] = 4;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  local_130.x.n[0] = 0;
  uVar5 = local_178[0] - 1 & *local_190;
  *local_190 = uVar5;
  uStack_1d0 = (code *)0x108571;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar5);
  puVar2 = local_1a8;
  local_178[0] = (uint)(local_1c4 == 0);
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[2] = 4;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  local_130.x.n[0] = 0;
  uVar5 = local_178[0] - 1 & *s;
  a = (secp256k1_fe *)(ulong)uVar5;
  *s = uVar5;
  uStack_1d0 = (code *)0x1085df;
  local_c8.x.n[1] = (uint64_t)s;
  secp256k1_scalar_verify((secp256k1_scalar *)a);
  if (puVar2 == (uint *)0x0) {
    return local_1c4;
  }
  local_c8.x.n[0] = CONCAT44(local_c8.x.n[0]._4_4_,(uint)(local_1c4 == 0));
  if (-1 < (int)*puVar2) {
    *puVar2 = (local_1c4 == 0) + 0x7fffffff & *puVar2;
    return local_1c4;
  }
LAB_00108623:
  uStack_1d0 = secp256k1_ec_seckey_verify;
  secp256k1_ecdsa_sign_inner_cold_2();
  if (a == (secp256k1_fe *)0x0) {
    secp256k1_ec_seckey_verify_cold_2();
  }
  else if (r_00 != (secp256k1_scalar *)0x0) {
    iVar3 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)((long)&uStack_1d0 + 4),(uchar *)r_00);
    return iVar3;
  }
  secp256k1_ec_seckey_verify_cold_1();
  return 0;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}